

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void bench_interpolate_step
               (vector<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*),_std::allocator<void_(*)(int,_int,_response_layer_*,_response_layer_*,_response_layer_*,_float_*)>_>
                *functions,fasthessian *fh,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  response_layer *top;
  response_layer *middle;
  response_layer *bottom;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int row;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int local_54;
  ulong local_50;
  
  lVar4 = *(long *)functions;
  lVar5 = *(long *)(functions + 8);
  if (lVar5 != lVar4) {
    local_50 = 0;
    iVar10 = fh->octaves;
    do {
      iVar9 = 1;
      if (0 < iVar10) {
        iVar3 = 0;
        local_54 = 0;
        do {
          do {
            lVar4 = (long)local_54;
            top = fh->response_map[(int)(&DAT_001a51a8)[lVar4 * 4 + (long)iVar3]];
            iVar10 = top->height;
            iVar6 = iVar3;
            if (0 < iVar10) {
              row = 0;
              middle = fh->response_map[(int)(&DAT_001a51a4)[lVar4 * 4 + (long)iVar3]];
              bottom = fh->response_map[(int)(&DAT_001a51a0)[lVar4 * 4 + (long)iVar3]];
              iVar3 = top->width;
              do {
                if (0 < iVar3) {
                  iVar10 = 0;
                  do {
                    bVar2 = is_extremum(row,iVar10,top,middle,bottom,fh->thresh);
                    if (bVar2) {
                      perf_interpolate_step
                                (*(_func_void_int_int_response_layer_ptr_response_layer_ptr_response_layer_ptr_float_ptr
                                   **)(*(long *)functions + local_50 * 8),row,iVar10,top,middle,
                                 bottom,(benchmark_data *)(local_50 * 0x238 + *(long *)data));
                      iVar3 = top->width;
                      iVar9 = iVar9 + 1;
                      if (iVar9 == 4) {
                        row = top->height;
                        iVar9 = 4;
                        local_54 = fh->octaves;
                        iVar6 = 2;
                        iVar10 = iVar3;
                      }
                    }
                    else {
                      iVar3 = top->width;
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < iVar3);
                  iVar10 = top->height;
                }
                row = row + 1;
              } while (row < iVar10);
            }
            iVar3 = iVar6 + 1;
          } while (iVar6 < 1);
          iVar10 = fh->octaves;
          local_54 = local_54 + 1;
          iVar3 = 0;
        } while (local_54 < iVar10);
        lVar4 = *(long *)functions;
        lVar5 = *(long *)(functions + 8);
      }
      uVar7 = (ulong)iVar9;
      lVar1 = *(long *)data;
      lVar8 = local_50 * 0x238;
      local_50 = local_50 + 1;
      *(ulong *)(lVar1 + 0x218 + lVar8) = *(ulong *)(lVar1 + 0x218 + lVar8) / uVar7;
      *(ulong *)(lVar1 + 0x228 + lVar8) = *(ulong *)(lVar1 + 0x228 + lVar8) / uVar7;
      *(ulong *)(lVar1 + 0x220 + lVar8) = *(ulong *)(lVar1 + 0x220 + lVar8) / uVar7;
      *(double *)(lVar1 + 0x230 + lVar8) = *(double *)(lVar1 + 0x230 + lVar8) / (double)iVar9;
    } while (local_50 < (ulong)(lVar5 - lVar4 >> 3));
  }
  return;
}

Assistant:

void bench_interpolate_step(const std::vector<void (*)(int, int, struct response_layer *, struct response_layer *, struct response_layer *, float[3])> &functions, 
                            struct fasthessian *fh, 
                            std::vector<struct benchmark_data> &data) {
    
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {

        int counter = 1;
        // Specifies how many times the benchmarikng for interpolate_step is called.
        // The average of the outcome will be taken
        int limit = 4;

        assert(fh != NULL);

        // filter index map
        const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
            {0, 1, 2, 3}, 
            {1, 3, 4, 5}, 
            {3, 5, 6, 7},
            //{5, 7, 8, 9},
            //{7, 9, 10, 11}
        };

        // getting response layers
        struct response_layer *bottom;
        struct response_layer *middle;
        struct response_layer *top;

        // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
        for (int o = 0; o < fh->octaves; ++o) {
            // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
            for (int i = 0; i <= 1; ++i) {
                // assigning respective bottom, middle and top response layer
                bottom = fh->response_map[filter_map[o][i]];
                middle = fh->response_map[filter_map[o][i + 1]];
                top = fh->response_map[filter_map[o][i + 2]];

                // iterating over middle response layer at density of the most sparse layer (always top),
                // to find maxima accreoss scale and space
                for (int r = 0; r < top->height; ++r) {
                    for (int c = 0; c < top->width; ++c) {
                        // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                        if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {
                            perf_interpolate_step(functions[j], r, c, top, middle, bottom, data[j]);
                            counter++;
                            if (counter == limit) {
                                c = top->width;
                                r = top->height;
                                i = 2;
                                o = fh->octaves;
                            }
                        }
                    }
                }
            }
        }

        data[j].avg_cycles /= counter;
        data[j].max_cycles /= counter;
        data[j].min_cycles /= counter;
        data[j].flops_per_cycle /= counter;

    }

}